

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O1

void __thiscall
anon_unknown.dwarf_23458d8::entry_to_remove::remove_self
          (entry_to_remove *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *entries)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer __s2;
  size_t sVar3;
  size_t __n;
  pointer pbVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  pointer pbVar9;
  
  lVar8 = this->count;
  if ((0 < lVar8) && ((this->value)._M_string_length != 0)) {
    pbVar1 = (entries->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (entries->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar1 == pbVar2) {
      lVar7 = 0;
    }
    else {
      __s2 = (this->value)._M_dataplus._M_p;
      sVar3 = (this->value)._M_string_length;
      lVar7 = 0;
      pbVar4 = pbVar1;
      do {
        pbVar9 = pbVar4 + 1;
        __n = pbVar4->_M_string_length;
        if ((__n == sVar3) &&
           (((__n == 0 || (iVar6 = bcmp((pbVar4->_M_dataplus)._M_p,__s2,__n), iVar6 == 0)) &&
            (lVar8 = lVar8 + -1, lVar8 == 0)))) {
          bVar5 = true;
          lVar8 = 0;
        }
        else {
          lVar7 = lVar7 + 1;
          bVar5 = false;
        }
      } while ((!bVar5) && (pbVar4 = pbVar9, pbVar9 != pbVar2));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(entries,pbVar1 + lVar7);
    return;
  }
  return;
}

Assistant:

void remove_self(std::vector<std::string>& entries) const
  {
    if (this->valid()) {
      long to_skip = this->count;
      long index_to_remove = 0;
      for (const auto& path : entries) {
        if (path == this->value && --to_skip == 0) {
          break;
        }
        ++index_to_remove;
      }
      entries.erase(entries.begin() + index_to_remove);
    }
  }